

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_type sVar10;
  size_t sVar11;
  size_type sVar12;
  
  uVar2 = *(undefined4 *)&info->field_0x34;
  (this->m_info).resultDisposition = info->resultDisposition;
  *(undefined4 *)&(this->m_info).field_0x34 = uVar2;
  uVar2 = *(undefined4 *)&(info->macroName).m_start;
  uVar3 = *(undefined4 *)((long)&(info->macroName).m_start + 4);
  sVar10 = (info->macroName).m_size;
  uVar4 = *(undefined4 *)((long)&(info->macroName).m_size + 4);
  uVar5 = *(undefined4 *)&(info->lineInfo).file;
  uVar6 = *(undefined4 *)((long)&(info->lineInfo).file + 4);
  sVar11 = (info->lineInfo).line;
  uVar7 = *(undefined4 *)((long)&(info->lineInfo).line + 4);
  uVar8 = *(undefined4 *)((long)&(info->capturedExpression).m_start + 4);
  sVar12 = (info->capturedExpression).m_size;
  uVar9 = *(undefined4 *)((long)&(info->capturedExpression).m_size + 4);
  *(undefined4 *)&(this->m_info).capturedExpression.m_start =
       *(undefined4 *)&(info->capturedExpression).m_start;
  *(undefined4 *)((long)&(this->m_info).capturedExpression.m_start + 4) = uVar8;
  *(int *)&(this->m_info).capturedExpression.m_size = (int)sVar12;
  *(undefined4 *)((long)&(this->m_info).capturedExpression.m_size + 4) = uVar9;
  *(undefined4 *)&(this->m_info).lineInfo.file = uVar5;
  *(undefined4 *)((long)&(this->m_info).lineInfo.file + 4) = uVar6;
  *(int *)&(this->m_info).lineInfo.line = (int)sVar11;
  *(undefined4 *)((long)&(this->m_info).lineInfo.line + 4) = uVar7;
  *(undefined4 *)&(this->m_info).macroName.m_start = uVar2;
  *(undefined4 *)((long)&(this->m_info).macroName.m_start + 4) = uVar3;
  *(int *)&(this->m_info).macroName.m_size = (int)sVar10;
  *(undefined4 *)((long)&(this->m_info).macroName.m_size + 4) = uVar4;
  (this->m_resultData).message._M_dataplus._M_p = (pointer)&(this->m_resultData).message.field_2;
  pcVar1 = (data->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_resultData,pcVar1,pcVar1 + (data->message)._M_string_length);
  (this->m_resultData).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_resultData).reconstructedExpression.field_2;
  pcVar1 = (data->reconstructedExpression)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_resultData).reconstructedExpression,pcVar1,
             pcVar1 + (data->reconstructedExpression)._M_string_length);
  LazyExpression::LazyExpression(&(this->m_resultData).lazyExpression,&data->lazyExpression);
  (this->m_resultData).resultType = data->resultType;
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData const& data )
    :   m_info( info ),
        m_resultData( data )
    {}